

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O2

bool __thiscall cbtSingleRayCallback::process(cbtSingleRayCallback *this,cbtBroadphaseProxy *proxy)

{
  float fVar1;
  RayResultCallback *pRVar2;
  cbtCollisionObject *collisionObject;
  undefined8 uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  
  pRVar2 = this->m_resultCallback;
  auVar5 = ZEXT816(0) << 0x40;
  fVar1 = pRVar2->m_closestHitFraction;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    collisionObject = (cbtCollisionObject *)proxy->m_clientObject;
    iVar4 = (*pRVar2->_vptr_RayResultCallback[2])(pRVar2,collisionObject->m_broadphaseHandle);
    auVar5 = ZEXT816(0) << 0x40;
    if ((char)iVar4 != '\0') {
      cbtCollisionWorld::rayTestSingle
                (&this->m_rayFromTrans,&this->m_rayToTrans,collisionObject,
                 collisionObject->m_collisionShape,&collisionObject->m_worldTransform,
                 this->m_resultCallback);
      auVar5 = ZEXT816(0) << 0x40;
    }
  }
  uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar1),auVar5,4);
  return (bool)((byte)uVar3 & 1);
}

Assistant:

virtual bool process(const cbtBroadphaseProxy* proxy)
	{
		///terminate further ray tests, once the closestHitFraction reached zero
		if (m_resultCallback.m_closestHitFraction == cbtScalar(0.f))
			return false;

		cbtCollisionObject* collisionObject = (cbtCollisionObject*)proxy->m_clientObject;

		//only perform raycast if filterMask matches
		if (m_resultCallback.needsCollision(collisionObject->getBroadphaseHandle()))
		{
			//RigidcollisionObject* collisionObject = ctrl->GetRigidcollisionObject();
			//cbtVector3 collisionObjectAabbMin,collisionObjectAabbMax;
#if 0
#ifdef RECALCULATE_AABB
			cbtVector3 collisionObjectAabbMin,collisionObjectAabbMax;
			collisionObject->getCollisionShape()->getAabb(collisionObject->getWorldTransform(),collisionObjectAabbMin,collisionObjectAabbMax);
#else
			//getBroadphase()->getAabb(collisionObject->getBroadphaseHandle(),collisionObjectAabbMin,collisionObjectAabbMax);
			const cbtVector3& collisionObjectAabbMin = collisionObject->getBroadphaseHandle()->m_aabbMin;
			const cbtVector3& collisionObjectAabbMax = collisionObject->getBroadphaseHandle()->m_aabbMax;
#endif
#endif
			//cbtScalar hitLambda = m_resultCallback.m_closestHitFraction;
			//culling already done by broadphase
			//if (cbtRayAabb(m_rayFromWorld,m_rayToWorld,collisionObjectAabbMin,collisionObjectAabbMax,hitLambda,m_hitNormal))
			{
				m_world->rayTestSingle(m_rayFromTrans, m_rayToTrans,
									   collisionObject,
									   collisionObject->getCollisionShape(),
									   collisionObject->getWorldTransform(),
									   m_resultCallback);
			}
		}
		return true;
	}